

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall
QTeamCityLogger::addPendingMessage(QTeamCityLogger *this,char *type,char *msg,char *file,int line)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  char *pad;
  QTestCharBuffer newMessage;
  QTestCharBuffer *in_stack_fffffffffffffd90;
  QTestCharBuffer *in_stack_fffffffffffffda8;
  QTestCharBuffer *in_stack_fffffffffffffdb0;
  undefined1 local_218 [104];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QTestCharBuffer::isEmpty((QTestCharBuffer *)(in_RDI + 0x220));
  pcVar3 = "|n";
  if (bVar2) {
    pcVar3 = "";
  }
  memset(local_218,0xaa,0x210);
  QTestCharBuffer::QTestCharBuffer((QTestCharBuffer *)local_218);
  if (in_RCX == 0) {
    QTest::qt_asprintf((QTestCharBuffer *)local_218,"%s%s: %s",pcVar3,in_RSI,in_RDX);
  }
  else {
    QTest::qt_asprintf((QTestCharBuffer *)local_218,"%s%s |[Loc: %s(%d)|]: %s",pcVar3,in_RSI,in_RCX,
                       (ulong)in_R8D,in_RDX);
  }
  QTestPrivate::appendCharBuffer(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  QTestCharBuffer::~QTestCharBuffer(in_stack_fffffffffffffd90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTeamCityLogger::addPendingMessage(const char *type, const char *msg,
                                        const char *file, int line)
{
    const char *pad = pendingMessages.isEmpty() ? "" : "|n";

    QTestCharBuffer newMessage;
    if (file)
        QTest::qt_asprintf(&newMessage, "%s%s |[Loc: %s(%d)|]: %s", pad, type, file, line, msg);
    else
        QTest::qt_asprintf(&newMessage, "%s%s: %s", pad, type, msg);

    QTestPrivate::appendCharBuffer(&pendingMessages, newMessage);
}